

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_regex.cpp
# Opt level: O2

int re_search(re_pattern_buffer *__buffer,char *__string,int __length,int __start,int __range,
             re_registers *__regs)

{
  char *pcVar1;
  size_type sVar2;
  char cVar3;
  bool bVar4;
  char cVar5;
  int iVar6;
  int extraout_EAX;
  ostream *poVar7;
  runtime_error *prVar8;
  undefined4 in_register_0000000c;
  string_type *r;
  undefined4 in_register_00000014;
  string *s;
  smatch sm;
  string local_1c8 [32];
  ostringstream oss;
  
  s = (string *)CONCAT44(in_register_00000014,__length);
  r = (string_type *)CONCAT44(in_register_0000000c,__start);
  cVar3 = (char)__buffer;
  booster::regex::regex((regex *)&oss,(string *)__string,0);
  bVar4 = booster::regex_search<booster::regex>(s,(regex *)&oss,0);
  booster::regex::~regex((regex *)&oss);
  if (bVar4 != (bool)cVar3) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&oss);
    poVar7 = std::operator<<((ostream *)&oss,"Error ");
    poVar7 = std::operator<<(poVar7,
                             "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/booster/lib/regex/test/test_regex.cpp"
                            );
    poVar7 = std::operator<<(poVar7,":");
    poVar7 = (ostream *)std::ostream::operator<<(poVar7,0x82);
    std::operator<<(poVar7," booster::regex_search(pat,booster::regex(re))==result");
    prVar8 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::stringbuf::str();
    std::runtime_error::runtime_error(prVar8,(string *)&sm);
    __cxa_throw(prVar8,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  pcVar1 = (s->_M_dataplus)._M_p;
  sVar2 = s->_M_string_length;
  booster::regex::regex((regex *)&oss,(string *)__string,0);
  cVar5 = booster::regex::search((char *)&oss,pcVar1,(int)sVar2 + (int)pcVar1);
  booster::regex::~regex((regex *)&oss);
  if (cVar5 != cVar3) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&oss);
    poVar7 = std::operator<<((ostream *)&oss,"Error ");
    poVar7 = std::operator<<(poVar7,
                             "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/booster/lib/regex/test/test_regex.cpp"
                            );
    poVar7 = std::operator<<(poVar7,":");
    poVar7 = (ostream *)std::ostream::operator<<(poVar7,0x83);
    std::operator<<(poVar7,
                    " booster::regex_search(pat.c_str(),pat.c_str()+pat.size(),booster::regex(re))==result"
                   );
    prVar8 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::stringbuf::str();
    std::runtime_error::runtime_error(prVar8,(string *)&sm);
    __cxa_throw(prVar8,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  pcVar1 = (s->_M_dataplus)._M_p;
  booster::regex::regex((regex *)&oss,(string *)__string,0);
  bVar4 = booster::regex_search<booster::regex>(pcVar1,(regex *)&oss,0);
  iVar6 = booster::regex::~regex((regex *)&oss);
  if (bVar4 != (bool)cVar3) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&oss);
    poVar7 = std::operator<<((ostream *)&oss,"Error ");
    poVar7 = std::operator<<(poVar7,
                             "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/booster/lib/regex/test/test_regex.cpp"
                            );
    poVar7 = std::operator<<(poVar7,":");
    poVar7 = (ostream *)std::ostream::operator<<(poVar7,0x84);
    std::operator<<(poVar7," booster::regex_search(pat.c_str(),booster::regex(re))==result");
    prVar8 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::stringbuf::str();
    std::runtime_error::runtime_error(prVar8,(string *)&sm);
    __cxa_throw(prVar8,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  if (cVar3 != '\0') {
    sm.offsets_.super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    sm.offsets_.super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
    _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    sm.begin_._M_current = (char *)0x0;
    sm.end_._M_current = (char *)0x0;
    sm.offsets_.super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    booster::regex::regex((regex *)&oss,(string *)__string,0);
    bVar4 = booster::regex_search<booster::regex>(s,&sm,(regex *)&oss,0);
    booster::regex::~regex((regex *)&oss);
    if (!bVar4) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&oss);
      poVar7 = std::operator<<((ostream *)&oss,"Error ");
      poVar7 = std::operator<<(poVar7,
                               "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/booster/lib/regex/test/test_regex.cpp"
                              );
      poVar7 = std::operator<<(poVar7,":");
      poVar7 = (ostream *)std::ostream::operator<<(poVar7,0x89);
      std::operator<<(poVar7," booster::regex_search(pat,sm,booster::regex(re))");
      prVar8 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::__cxx11::stringbuf::str();
      std::runtime_error::runtime_error(prVar8,local_1c8);
      __cxa_throw(prVar8,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    booster::
    match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::operator[]((value_type *)&oss,&sm,__range);
    bVar4 = booster::operator==((sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 *)&oss,r);
    if (!bVar4) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&oss);
      poVar7 = std::operator<<((ostream *)&oss,"Error ");
      poVar7 = std::operator<<(poVar7,
                               "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/booster/lib/regex/test/test_regex.cpp"
                              );
      poVar7 = std::operator<<(poVar7,":");
      poVar7 = (ostream *)std::ostream::operator<<(poVar7,0x8a);
      std::operator<<(poVar7," sm[pos]==key");
      prVar8 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::__cxx11::stringbuf::str();
      std::runtime_error::runtime_error(prVar8,local_1c8);
      __cxa_throw(prVar8,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    std::_Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::~_Vector_base
              (&sm.offsets_.
                super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>);
    sm.offsets_.super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    sm.offsets_.super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    sm.offsets_.super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
    _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    sm.begin_._M_current = (char *)0x0;
    sm.end_._M_current = (char *)0x0;
    pcVar1 = (s->_M_dataplus)._M_p;
    sVar2 = s->_M_string_length;
    booster::regex::regex((regex *)&oss,(string *)__string,0);
    bVar4 = booster::regex_search<booster::regex>
                      (pcVar1,pcVar1 + sVar2,(cmatch *)&sm,(regex *)&oss,0);
    booster::regex::~regex((regex *)&oss);
    if (!bVar4) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&oss);
      poVar7 = std::operator<<((ostream *)&oss,"Error ");
      poVar7 = std::operator<<(poVar7,
                               "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/booster/lib/regex/test/test_regex.cpp"
                              );
      poVar7 = std::operator<<(poVar7,":");
      poVar7 = (ostream *)std::ostream::operator<<(poVar7,0x8e);
      std::operator<<(poVar7,
                      " booster::regex_search(pat.c_str(),pat.c_str()+pat.size(),cm,booster::regex(re))"
                     );
      prVar8 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::__cxx11::stringbuf::str();
      std::runtime_error::runtime_error(prVar8,local_1c8);
      __cxa_throw(prVar8,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    booster::match_results<const_char_*>::operator[]
              ((value_type *)&oss,(match_results<const_char_*> *)&sm,__range);
    bVar4 = booster::operator==((sub_match<const_char_*> *)&oss,r);
    if (!bVar4) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&oss);
      poVar7 = std::operator<<((ostream *)&oss,"Error ");
      poVar7 = std::operator<<(poVar7,
                               "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/booster/lib/regex/test/test_regex.cpp"
                              );
      poVar7 = std::operator<<(poVar7,":");
      poVar7 = (ostream *)std::ostream::operator<<(poVar7,0x8f);
      std::operator<<(poVar7," cm[pos]==key");
      prVar8 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::__cxx11::stringbuf::str();
      std::runtime_error::runtime_error(prVar8,local_1c8);
      __cxa_throw(prVar8,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    std::_Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::~_Vector_base
              (&sm.offsets_.
                super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>);
    sm.offsets_.super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    sm.offsets_.super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
    _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    sm.begin_._M_current = (char *)0x0;
    sm.end_._M_current = (char *)0x0;
    sm.offsets_.super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    pcVar1 = (s->_M_dataplus)._M_p;
    booster::regex::regex((regex *)&oss,(string *)__string,0);
    bVar4 = booster::regex_search<booster::regex>(pcVar1,(cmatch *)&sm,(regex *)&oss,0);
    booster::regex::~regex((regex *)&oss);
    if (!bVar4) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&oss);
      poVar7 = std::operator<<((ostream *)&oss,"Error ");
      poVar7 = std::operator<<(poVar7,
                               "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/booster/lib/regex/test/test_regex.cpp"
                              );
      poVar7 = std::operator<<(poVar7,":");
      poVar7 = (ostream *)std::ostream::operator<<(poVar7,0x93);
      std::operator<<(poVar7," booster::regex_search(pat.c_str(),cm,booster::regex(re))");
      prVar8 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::__cxx11::stringbuf::str();
      std::runtime_error::runtime_error(prVar8,local_1c8);
      __cxa_throw(prVar8,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    booster::match_results<const_char_*>::operator[]
              ((value_type *)&oss,(match_results<const_char_*> *)&sm,__range);
    bVar4 = booster::operator==((sub_match<const_char_*> *)&oss,r);
    if (!bVar4) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&oss);
      poVar7 = std::operator<<((ostream *)&oss,"Error ");
      poVar7 = std::operator<<(poVar7,
                               "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/booster/lib/regex/test/test_regex.cpp"
                              );
      poVar7 = std::operator<<(poVar7,":");
      poVar7 = (ostream *)std::ostream::operator<<(poVar7,0x94);
      std::operator<<(poVar7," cm[pos]==key");
      prVar8 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::__cxx11::stringbuf::str();
      std::runtime_error::runtime_error(prVar8,local_1c8);
      __cxa_throw(prVar8,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    std::_Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::~_Vector_base
              (&sm.offsets_.
                super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>);
    iVar6 = extraout_EAX;
  }
  return iVar6;
}

Assistant:

void re_search(bool result,std::string re,std::string pat,std::string key="",int pos=0)
{
	TEST(booster::regex_search(pat,booster::regex(re))==result);
	TEST(booster::regex_search(pat.c_str(),pat.c_str()+pat.size(),booster::regex(re))==result);
	TEST(booster::regex_search(pat.c_str(),booster::regex(re))==result);

	if(result) {
		{
			booster::smatch sm;
			TEST(booster::regex_search(pat,sm,booster::regex(re)));
			TEST(sm[pos]==key);
		}
		{
			booster::cmatch cm;
			TEST(booster::regex_search(pat.c_str(),pat.c_str()+pat.size(),cm,booster::regex(re)));
			TEST(cm[pos]==key);
		}
		{
			booster::cmatch cm;
			TEST(booster::regex_search(pat.c_str(),cm,booster::regex(re)));
			TEST(cm[pos]==key);
		}
	}
}